

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int yylex_RAW(void)

{
  bool bVar1;
  int iVar2;
  bool local_39;
  int local_24;
  char v_2;
  char v_1;
  char v;
  size_t sStack_20;
  int c;
  size_t i;
  size_t parenDepth;
  
  i = 0;
  sStack_20 = 0;
  while( true ) {
    while( true ) {
      iVar2 = peek();
      bVar1 = isWhitespace(iVar2);
      if (!bVar1) break;
      shiftChar();
    }
    if (iVar2 != 0x5c) goto LAB_00110b84;
    shiftChar();
    local_24 = peek();
    bVar1 = isWhitespace(local_24);
    if (((!bVar1) && (local_24 != 10)) && (local_24 != 0xd)) break;
    readLineContinuation();
  }
LAB_00110cdf:
  switch(local_24) {
  default:
    printChar(local_24);
    error("Illegal character escape %s\n");
    break;
  case 10:
  case 0xd:
  case 0x20:
    readLineContinuation();
    goto LAB_00110b84;
  case 0x22:
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x5c:
  case 0x7b:
  case 0x7d:
    break;
  case 0x6e:
    local_24 = 10;
    break;
  case 0x72:
    local_24 = 0xd;
    break;
  case 0x74:
    local_24 = 9;
    break;
  case -1:
    error("Illegal character escape at end of input\n");
    local_24 = 0x5c;
  }
switchD_00110bb2_caseD_0:
LAB_00110d5e:
  if (sStack_20 < 0x100) {
    yylval.symName[sStack_20] = (char)local_24;
    sStack_20 = sStack_20 + 1;
  }
  shiftChar();
LAB_00110b84:
  local_24 = peek();
  switch(local_24) {
  default:
    goto switchD_00110bb2_caseD_0;
  case 0x22:
    shiftChar();
    sStack_20 = appendStringLiteral(sStack_20,false);
    goto LAB_00110b84;
  case 0x23:
    if (sStack_20 < 0x100) {
      yylval.symName[sStack_20] = (char)local_24;
      sStack_20 = sStack_20 + 1;
    }
    shiftChar();
    iVar2 = peek();
    if (iVar2 == 0x22) {
      shiftChar();
      sStack_20 = appendStringLiteral(sStack_20,true);
    }
    goto LAB_00110b84;
  case 0x28:
    goto switchD_00110bb2_caseD_28;
  case 0x29:
    if (i != 0) {
      i = i - 1;
    }
    goto LAB_00110d5e;
  case 0x2c:
    if (i != 0) goto LAB_00110d5e;
    break;
  case 0x2f:
    goto switchD_00110bb2_caseD_2f;
  case 0x3b:
    discardComment();
    local_24 = peek();
  case -1:
  case 10:
  case 0xd:
    break;
  case 0x5c:
    shiftChar();
    local_24 = peek();
    goto LAB_00110cdf;
  }
  if (sStack_20 == 0x100) {
    sStack_20 = 0xff;
    warning(WARNING_LONG_STR,"Macro argument too long\n");
  }
  while( true ) {
    local_39 = false;
    if (sStack_20 != 0) {
      local_39 = isWhitespace((int)*(char *)(sStack_20 + 0x132367));
    }
    if (local_39 == false) break;
    sStack_20 = sStack_20 - 1;
  }
  yylval.symName[sStack_20] = '\0';
  if (local_24 == 0x2c) {
    shiftChar();
    parenDepth._4_4_ = 4;
  }
  else if (sStack_20 == 0) {
    lexer_SetMode(LEXER_NORMAL);
    if ((local_24 == 0xd) || (local_24 == 10)) {
      shiftChar();
      handleCRLF(local_24);
      parenDepth._4_4_ = 0xd;
    }
    else {
      parenDepth._4_4_ = 0;
    }
  }
  else {
    parenDepth._4_4_ = 4;
  }
  return parenDepth._4_4_;
switchD_00110bb2_caseD_2f:
  shiftChar();
  iVar2 = peek();
  if (iVar2 == 0x2a) {
    shiftChar();
    discardBlockComment();
  }
  else if (sStack_20 < 0x100) {
    yylval.symName[sStack_20] = (char)local_24;
    sStack_20 = sStack_20 + 1;
  }
  goto LAB_00110b84;
switchD_00110bb2_caseD_28:
  if (i < 0xffffffff) {
    i = i + 1;
  }
  goto LAB_00110d5e;
}

Assistant:

static int yylex_RAW(void)
{
	// This is essentially a modified `appendStringLiteral`
	size_t parenDepth = 0;
	size_t i = 0;
	int c;

	// Trim left whitespace (stops at a block comment)
	for (;;) {
		c = peek();
		if (isWhitespace(c)) {
			shiftChar();
		} else if (c == '\\') {
			shiftChar();
			c = peek();
			// If not a line continuation, handle as a normal char
			if (!isWhitespace(c) && c != '\n' && c != '\r')
				goto backslash;
			// Line continuations count as "whitespace"
			readLineContinuation();
		} else {
			break;
		}
	}

	for (;;) {
		c = peek();

		switch (c) {
		case '"': // String literals inside macro args
			shiftChar();
			i = appendStringLiteral(i, false);
			break;

		case '#': // Raw string literals inside macro args
			append_yylval_string(c);
			shiftChar();
			if (peek() == '"') {
				shiftChar();
				i = appendStringLiteral(i, true);
			}
			break;

		case ';': // Comments inside macro args
			discardComment();
			c = peek();
			// fallthrough
		case '\r': // End of line
		case '\n':
		case EOF:
			goto finish;

		case '/': // Block comments inside macro args
			shiftChar();
			if (peek() == '*') {
				shiftChar();
				discardBlockComment();
				continue;
			}
			append_yylval_string(c); // Append the slash
			break;

		case ',': // End of macro arg
			if (parenDepth == 0)
				goto finish;
			goto append;

		case '(': // Open parentheses inside macro args
			if (parenDepth < UINT_MAX)
				parenDepth++;
			goto append;

		case ')': // Close parentheses inside macro args
			if (parenDepth > 0)
				parenDepth--;
			goto append;

		case '\\': // Character escape
			shiftChar();
			c = peek();

backslash:
			switch (c) {
			case ',': // Escapes only valid inside a macro arg
			case '(':
			case ')':
			case '\\': // Escapes shared with string literals
			case '"':
			case '{':
			case '}':
				break;

			case 'n':
				c = '\n';
				break;
			case 'r':
				c = '\r';
				break;
			case 't':
				c = '\t';
				break;

			case ' ':
			case '\r':
			case '\n':
				readLineContinuation();
				continue;

			case EOF: // Can't really print that one
				error("Illegal character escape at end of input\n");
				c = '\\';
				break;

			// Macro args were already handled by peek, so '\@',
			// '\#', and '\0'-'\9' should not occur here.

			default:
				error("Illegal character escape %s\n", printChar(c));
				break;
			}
			// fallthrough

		default: // Regular characters will just get copied
append:
			append_yylval_string(c);
			shiftChar();
			break;
		}
	}

finish:
	if (i == sizeof(yylval.string)) {
		i--;
		warning(WARNING_LONG_STR, "Macro argument too long\n");
	}
	// Trim right whitespace
	while (i && isWhitespace(yylval.string[i - 1]))
		i--;
	yylval.string[i] = '\0';

	// Returning T_COMMAs to the parser would mean that two consecutive commas
	// (i.e. an empty argument) need to return two different tokens (T_STRING
	// then T_COMMA) without advancing the read. To avoid this, commas in raw
	// mode end the current macro argument but are not tokenized themselves.
	if (c == ',') {
		shiftChar();
		return T_STRING;
	}

	// The last argument may end in a trailing comma, newline, or EOF.
	// To allow trailing commas, raw mode will continue after the last
	// argument, immediately lexing the newline or EOF again (i.e. with
	// an empty raw string before it). This will not be treated as a
	// macro argument. To pass an empty last argument, use a second
	// trailing comma.
	if (i > 0)
		return T_STRING;
	lexer_SetMode(LEXER_NORMAL);

	if (c == '\r' || c == '\n') {
		shiftChar();
		handleCRLF(c);
		return T_NEWLINE;
	}

	return T_EOF;
}